

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_validate.cc
# Opt level: O2

void VW::validate_default_bits(vw *all,uint32_t param_2)

{
  ostream *poVar1;
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if ((all->default_bits == false) && (all->num_bits != param_2)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar1 = std::operator<<(&local_190,"-b bits mismatch: command-line ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," stored in model");
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/vw_validate.cc"
               ,0x1d,&local_1c0);
    __cxa_throw(this,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  return;
}

Assistant:

void validate_default_bits(vw& all, uint32_t local_num_bits)
{
  if (all.default_bits != true && all.num_bits != local_num_bits)
    THROW("-b bits mismatch: command-line " << all.num_bits << " != " << local_num_bits << " stored in model");
}